

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O2

void __thiscall
glslang::TInfoSinkBase::location
          (TInfoSinkBase *this,TSourceLoc *loc,bool absolute,bool displayColumn)

{
  undefined7 in_register_00000009;
  string location;
  char locText [24];
  path local_98;
  path local_70;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000009,displayColumn) == 0) {
    snprintf(locText,0x18,":%d",(ulong)(uint)loc->line);
  }
  else {
    snprintf(locText,0x18,":%d:%d",(ulong)(uint)loc->line,(ulong)(uint)loc->column);
  }
  if (((loc->name == (TString *)0x0) || ((loc->name->_M_dataplus)._M_p == (pointer)0x0)) &&
     (absolute && this->shaderFileName != (char *)0x0)) {
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_98,&this->shaderFileName,auto_format);
    std::filesystem::absolute(&local_70);
    std::filesystem::__cxx11::path::string(&location,&local_70);
    append(this,&location);
    std::__cxx11::string::_M_dispose();
    std::filesystem::__cxx11::path::~path(&local_70);
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  else {
    TSourceLoc::getStringNameOrNum_abi_cxx11_(&location,loc,false);
    if (absolute) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_98,&location,auto_format);
      std::filesystem::absolute(&local_70);
      std::filesystem::__cxx11::path::string(&local_48,&local_70);
      append(this,&local_48);
      std::__cxx11::string::_M_dispose();
      std::filesystem::__cxx11::path::~path(&local_70);
      std::filesystem::__cxx11::path::~path(&local_98);
    }
    else {
      append(this,&location);
    }
    std::__cxx11::string::_M_dispose();
  }
  append(this,locText);
  append(this,": ");
  return;
}

Assistant:

void location(const TSourceLoc& loc, bool absolute = false, bool displayColumn = false) {
        const int maxSize = 24;
        char locText[maxSize];
        if (displayColumn) {
            snprintf(locText, maxSize, ":%d:%d", loc.line, loc.column);
        } else {
            snprintf(locText, maxSize, ":%d", loc.line);
        }

        if(loc.getFilename() == nullptr && shaderFileName != nullptr && absolute) {
            append(std::filesystem::absolute(shaderFileName).string());
        } else {
            std::string location = loc.getStringNameOrNum(false);
            if (absolute) {
                append(std::filesystem::absolute(location).string());
            } else {
                append(location);
            }
        }

        append(locText);
        append(": ");
    }